

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# method.h
# Opt level: O2

void __thiscall iqxmlrpc::Method::Method(Method *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_Method = (_func_int **)&PTR__Method_0019be88;
  (this->data_).method_name._M_dataplus._M_p = (pointer)&(this->data_).method_name.field_2;
  (this->data_).method_name._M_string_length = 0;
  (this->data_).method_name.field_2._M_local_buf[0] = '\0';
  (this->data_).peer_addr._vptr_Inet_addr = (_func_int **)&PTR__Inet_addr_0019be08;
  (this->data_).peer_addr.impl_.px = (element_type *)0x0;
  (this->data_).peer_addr.impl_.pn.pi_ = (sp_counted_base *)0x0;
  (this->data_).server_face.server_ = (Server *)0x0;
  (this->authname_)._M_dataplus._M_p = (pointer)&(this->authname_).field_2;
  (this->authname_)._M_string_length = 0;
  (this->authname_).field_2._M_local_buf[0] = '\0';
  (this->xheaders_)._vptr_XHeaders = (_func_int **)&PTR_operator__0019f458;
  p_Var1 = &(this->xheaders_).xheaders_._M_t._M_impl.super__Rb_tree_header;
  (this->xheaders_).xheaders_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->xheaders_).xheaders_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->xheaders_).xheaders_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->xheaders_).xheaders_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->xheaders_).xheaders_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

class LIBIQXMLRPC_API Method {
public:
  struct Data {
    std::string      method_name;
    iqnet::Inet_addr peer_addr;
    Server_feedback  server_face;
  };

private:
  friend class Method_dispatcher_base;
  Data data_;
  std::string authname_;
  XHeaders xheaders_;

public:
  virtual ~Method() {}

  //! Calls customized execute() and optionally wraps it with interceptors.
  //! Is is called by a server object.
  void process_execution(Interceptor*, const Param_list& params, Value& response);

  const std::string&      name()      const { return data_.method_name; }
  const iqnet::Inet_addr& peer_addr() const { return data_.peer_addr; }
  Server_feedback&        server()          { return data_.server_face; }

  bool                    authenticated() const { return !authname_.empty(); }
  const std::string&      authname()      const { return authname_; }
  void                    authname(const std::string& n) { authname_ = n; }

  XHeaders&               xheaders() { return xheaders_; }

private:
  //! Replace it with your actual code.
  virtual void execute( const Param_list& params, Value& response ) = 0;
}